

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void twopass_update_bpm_factor(AV1_COMP *cpi,int rate_err_tol)

{
  long lVar1;
  long lVar2;
  int in_ESI;
  long *in_RDI;
  double dVar3;
  double max_fac;
  double min_fac;
  double adj_limit;
  double rate_err_factor;
  PRIMARY_RATE_CONTROL *p_rc;
  TWO_PASS *twopass;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a0;
  double local_98;
  double local_90;
  double local_80;
  double local_78;
  double error_fraction_1;
  double error_fraction;
  double rolling_arf_group_target_bits;
  double rolling_arf_group_actual_bits;
  int64_t total_actual_bits;
  int err_estimate;
  
  lVar1 = *in_RDI;
  lVar2 = *in_RDI;
  error_fraction = 1.0;
  if (0.2 <= (double)(100 - in_ESI) / 200.0) {
    local_78 = (double)(100 - in_ESI) / 200.0;
  }
  else {
    local_78 = 0.2;
  }
  local_b8 = 1.0 - local_78;
  local_c0 = local_78 + 1.0;
  dVar3 = (double)*(int *)(lVar1 + 0x8b14);
  local_80 = (double)*(int *)(lVar1 + 0x8b10);
  if (((*(long *)(lVar2 + 0xad58) != 0) && (0 < *(long *)(lVar2 + 0xad28))) && (1.0 <= local_80)) {
    if (dVar3 <= local_80) {
      error_fraction = 1.0 - (local_80 - dVar3) / local_80;
    }
    else {
      local_80 = (dVar3 - local_80) / local_80;
      if (1.0 < local_80) {
        local_80 = 1.0;
      }
      error_fraction = local_80 + 1.0;
    }
    local_90 = local_c0;
    if (error_fraction <= local_c0) {
      local_90 = error_fraction;
    }
    local_98 = local_b8;
    if (local_b8 <= local_90) {
      local_a0 = local_c0;
      if (error_fraction <= local_c0) {
        local_a0 = error_fraction;
      }
      local_98 = local_a0;
    }
    error_fraction = local_98;
  }
  if (((error_fraction < 1.0) && (-1 < *(int *)(lVar2 + 0xad40))) ||
     ((1.0 < error_fraction && (*(int *)(lVar2 + 0xad40) < 1)))) {
    *(double *)(lVar1 + 0x8b08) = error_fraction * *(double *)(lVar1 + 0x8b08);
    local_b0 = local_c0;
    if (*(double *)(lVar1 + 0x8b08) <= local_c0) {
      local_b0 = *(double *)(lVar1 + 0x8b08);
    }
    if (local_b8 <= local_b0) {
      if (*(double *)(lVar1 + 0x8b08) <= local_c0) {
        local_c0 = *(double *)(lVar1 + 0x8b08);
      }
      local_b8 = local_c0;
    }
    *(double *)(lVar1 + 0x8b08) = local_b8;
  }
  return;
}

Assistant:

static void twopass_update_bpm_factor(AV1_COMP *cpi, int rate_err_tol) {
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;

  // Based on recent history adjust expectations of bits per macroblock.
  double rate_err_factor = 1.0;
  const double adj_limit = AOMMAX(0.2, (double)(100 - rate_err_tol) / 200.0);
  const double min_fac = 1.0 - adj_limit;
  const double max_fac = 1.0 + adj_limit;

#if CONFIG_THREE_PASS
  if (cpi->third_pass_ctx && cpi->third_pass_ctx->frame_info_count > 0) {
    int64_t actual_bits = 0;
    int64_t target_bits = 0;
    double factor = 0.0;
    int count = 0;
    for (int i = 0; i < cpi->third_pass_ctx->frame_info_count; i++) {
      actual_bits += cpi->third_pass_ctx->frame_info[i].actual_bits;
      target_bits += cpi->third_pass_ctx->frame_info[i].bits_allocated;
      factor += cpi->third_pass_ctx->frame_info[i].bpm_factor;
      count++;
    }

    if (count == 0) {
      factor = 1.0;
    } else {
      factor /= (double)count;
    }

    factor *= (double)actual_bits / DOUBLE_DIVIDE_CHECK((double)target_bits);

    if ((twopass->bpm_factor <= 1 && factor < twopass->bpm_factor) ||
        (twopass->bpm_factor >= 1 && factor > twopass->bpm_factor)) {
      twopass->bpm_factor = factor;
      twopass->bpm_factor =
          AOMMAX(min_fac, AOMMIN(max_fac, twopass->bpm_factor));
    }
  }
#endif  // CONFIG_THREE_PASS

  int err_estimate = p_rc->rate_error_estimate;
  int64_t total_actual_bits = p_rc->total_actual_bits;
  double rolling_arf_group_actual_bits =
      (double)twopass->rolling_arf_group_actual_bits;
  double rolling_arf_group_target_bits =
      (double)twopass->rolling_arf_group_target_bits;

#if CONFIG_FPMT_TEST
  const int is_parallel_frame =
      cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0 ? 1 : 0;
  const int simulate_parallel_frame =
      cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE
          ? is_parallel_frame
          : 0;
  total_actual_bits = simulate_parallel_frame ? p_rc->temp_total_actual_bits
                                              : p_rc->total_actual_bits;
  rolling_arf_group_target_bits =
      (double)(simulate_parallel_frame
                   ? p_rc->temp_rolling_arf_group_target_bits
                   : twopass->rolling_arf_group_target_bits);
  rolling_arf_group_actual_bits =
      (double)(simulate_parallel_frame
                   ? p_rc->temp_rolling_arf_group_actual_bits
                   : twopass->rolling_arf_group_actual_bits);
  err_estimate = simulate_parallel_frame ? p_rc->temp_rate_error_estimate
                                         : p_rc->rate_error_estimate;
#endif

  if ((p_rc->bits_off_target && total_actual_bits > 0) &&
      (rolling_arf_group_target_bits >= 1.0)) {
    if (rolling_arf_group_actual_bits > rolling_arf_group_target_bits) {
      double error_fraction =
          (rolling_arf_group_actual_bits - rolling_arf_group_target_bits) /
          rolling_arf_group_target_bits;
      error_fraction = (error_fraction > 1.0) ? 1.0 : error_fraction;
      rate_err_factor = 1.0 + error_fraction;
    } else {
      double error_fraction =
          (rolling_arf_group_target_bits - rolling_arf_group_actual_bits) /
          rolling_arf_group_target_bits;
      rate_err_factor = 1.0 - error_fraction;
    }

    rate_err_factor = AOMMAX(min_fac, AOMMIN(max_fac, rate_err_factor));
  }

  // Is the rate control trending in the right direction. Only make
  // an adjustment if things are getting worse.
  if ((rate_err_factor < 1.0 && err_estimate >= 0) ||
      (rate_err_factor > 1.0 && err_estimate <= 0)) {
    twopass->bpm_factor *= rate_err_factor;
    twopass->bpm_factor = AOMMAX(min_fac, AOMMIN(max_fac, twopass->bpm_factor));
  }
}